

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcSpatialStructureElementType::~IfcSpatialStructureElementType
          (IfcSpatialStructureElementType *this)

{
  ~IfcSpatialStructureElementType
            ((IfcSpatialStructureElementType *)
             &this[-1].super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x60);
  return;
}

Assistant:

IfcSpatialStructureElementType() : Object("IfcSpatialStructureElementType") {}